

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_enc.c
# Opt level: O0

int asn1_i2d_ex_primitive(ASN1_VALUE **pval,uchar **out,ASN1_ITEM *it,int tag,int aclass)

{
  bool bVar1;
  int in_ECX;
  ASN1_ITEM *in_RDX;
  uchar **in_RSI;
  ASN1_VALUE **in_RDI;
  int in_R8D;
  int ndef;
  int usetag;
  int utype;
  int len;
  int local_38;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  ASN1_ITEM *local_20;
  uchar **local_18;
  ASN1_VALUE **local_10;
  int local_4;
  
  local_38 = 0;
  local_30 = (int)in_RDX->utype;
  local_28 = in_R8D;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_2c = asn1_ex_i2c(in_RDI,(uchar *)0x0,&local_30,in_RDX);
  if (((local_30 == 0x10) || (local_30 == 0x11)) || (local_30 == -3)) {
    bVar1 = false;
  }
  else {
    bVar1 = true;
  }
  if (local_2c == -1) {
    local_4 = 0;
  }
  else {
    if (local_2c == -2) {
      local_38 = 2;
      local_2c = 0;
    }
    if (local_24 == -1) {
      local_24 = local_30;
    }
    if (local_18 != (uchar **)0x0) {
      if (bVar1) {
        ASN1_put_object(local_18,local_38,local_2c,local_24,local_28);
      }
      asn1_ex_i2c(local_10,*local_18,&local_30,local_20);
      if (local_38 == 0) {
        *local_18 = *local_18 + local_2c;
      }
      else {
        ASN1_put_eoc(local_18);
      }
    }
    if (bVar1) {
      local_4 = ASN1_object_size(local_38,local_2c,local_24);
    }
    else {
      local_4 = local_2c;
    }
  }
  return local_4;
}

Assistant:

static int asn1_i2d_ex_primitive(const ASN1_VALUE **pval, unsigned char **out,
                                 const ASN1_ITEM *it, int tag, int aclass)
{
    int len;
    int utype;
    int usetag;
    int ndef = 0;

    utype = it->utype;

    /*
     * Get length of content octets and maybe find out the underlying type.
     */

    len = asn1_ex_i2c(pval, NULL, &utype, it);

    /*
     * If SEQUENCE, SET or OTHER then header is included in pseudo content
     * octets so don't include tag+length. We need to check here because the
     * call to asn1_ex_i2c() could change utype.
     */
    if ((utype == V_ASN1_SEQUENCE) || (utype == V_ASN1_SET) ||
        (utype == V_ASN1_OTHER))
        usetag = 0;
    else
        usetag = 1;

    /* -1 means omit type */

    if (len == -1)
        return 0;

    /* -2 return is special meaning use ndef */
    if (len == -2) {
        ndef = 2;
        len = 0;
    }

    /* If not implicitly tagged get tag from underlying type */
    if (tag == -1)
        tag = utype;

    /* Output tag+length followed by content octets */
    if (out) {
        if (usetag)
            ASN1_put_object(out, ndef, len, tag, aclass);
        asn1_ex_i2c(pval, *out, &utype, it);
        if (ndef)
            ASN1_put_eoc(out);
        else
            *out += len;
    }

    if (usetag)
        return ASN1_object_size(ndef, len, tag);
    return len;
}